

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::Maximum
               (Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
               uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,
               uint32_t height)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Image *pIVar4;
  byte bVar5;
  uchar *puVar6;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  uchar *puVar7;
  ulong uVar8;
  undefined4 in_register_0000008c;
  uchar *puVar9;
  uchar *puVar10;
  uint local_a8;
  uint local_a4;
  Image *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  Image *local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  local_98 = CONCAT44(in_register_0000008c,startY2);
  local_90 = CONCAT44(in_register_00000014,startY1);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in1,startX1,startY1,in2,startX2,startY2,out,startXOut,startYOut,width,height);
  local_88 = in1;
  bVar5 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>(in1,in2,out);
  local_a4 = (uint)bVar5;
  local_a8 = width * local_a4;
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00121b28;
  local_58._data = (uchar *)0x0;
  local_58._type = in2->_type;
  local_a0 = in2;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)in2,src);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00121b28;
  local_80._data = (uchar *)0x0;
  local_80._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src_00);
  pIVar4 = local_88;
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&local_a8,&height,local_88,&local_58,&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00121b28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00121b28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar1 = out->_rowSize;
  if (height * uVar1 != 0) {
    puVar10 = out->_data + (ulong)(startXOut * local_a4) + (ulong)(startYOut * uVar1);
    uVar2 = local_a0->_rowSize;
    puVar6 = puVar10 + height * uVar1;
    puVar7 = local_a0->_data + (ulong)(startX2 * local_a4) + (ulong)((int)local_98 * uVar2);
    uVar3 = pIVar4->_rowSize;
    puVar9 = pIVar4->_data + (ulong)(startX1 * local_a4) + (ulong)((int)local_90 * uVar3);
    do {
      if ((ulong)local_a8 != 0) {
        uVar8 = 0;
        do {
          bVar5 = puVar9[uVar8];
          if (puVar9[uVar8] < puVar7[uVar8]) {
            bVar5 = puVar7[uVar8];
          }
          puVar10[uVar8] = bVar5;
          uVar8 = uVar8 + 1;
        } while (local_a8 != uVar8);
      }
      puVar10 = puVar10 + uVar1;
      puVar9 = puVar9 + uVar3;
      puVar7 = puVar7 + uVar2;
    } while (puVar10 != puVar6);
  }
  return;
}

Assistant:

void Maximum( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                  Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height )
    {
        ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );

        const uint8_t colorCount  = CommonColorCount( in1, in2, out );
        width = width * colorCount;

        OptimiseRoi( width, height, in1, in2, out );

        const uint32_t rowSize1   = in1.rowSize();
        const uint32_t rowSize2   = in2.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * in1Y = in1.data() + startY1   * rowSize1   + startX1   * colorCount;
        const uint8_t * in2Y = in2.data() + startY2   * rowSize2   + startX2   * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSize1, in2Y += rowSize2 ) {
            const uint8_t * in1X = in1Y;
            const uint8_t * in2X = in2Y;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++in1X, ++in2X )
                (*outX) = (*in2X) < (*in1X) ? (*in1X) : (*in2X);
        }
    }